

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O3

void __thiscall Sealer::CalculateMerkRoot(Sealer *this,Cache *ca,Blockchain *bc)

{
  ostream *poVar1;
  stringstream ss;
  string local_240;
  string local_220;
  undefined1 local_200 [80];
  undefined1 local_1b0 [16];
  _Elt_pointer local_1a0;
  _Elt_pointer local_180;
  ios_base local_130 [264];
  
  Cache::GetTransQueue
            ((queue<Message,_std::deque<Message,_std::allocator<Message>_>_> *)local_1b0,ca);
  std::deque<Message,_std::allocator<Message>_>::~deque
            ((deque<Message,_std::allocator<Message>_> *)local_1b0);
  if (local_180 != local_1a0) {
    this->trans_count = this->trans_count + 1;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    Cache::GetTransQueue
              ((queue<Message,_std::deque<Message,_std::allocator<Message>_>_> *)local_200,ca);
    Message::diggest_abi_cxx11_(&local_220,(Message *)local_200._16_8_);
    std::__cxx11::string::operator=((string *)this,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::deque<Message,_std::allocator<Message>_>::~deque
              ((deque<Message,_std::allocator<Message>_> *)local_200);
    Cache::PopTransQueue(ca);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,(this->merkle_root)._M_dataplus._M_p,
                        (this->merkle_root)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->str)._M_dataplus._M_p,(this->str)._M_string_length);
    std::__cxx11::stringbuf::str();
    sha256((string *)local_200,&local_240);
    std::__cxx11::string::operator=((string *)&this->merkle_root,(string *)local_200);
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void  Sealer::CalculateMerkRoot(Cache & ca,Blockchain & bc)  {
    if(!IsCacheEmpty(ca))
    {
        trans_count++;
        //std::cout << "交易池中的交易数："<<trans_count << std::endl;
        std::stringstream ss;
        str = ca.GetTransQueue().front().diggest();
        ca.PopTransQueue();
        ss << merkle_root << str;
        merkle_root = sha256(ss.str());
    }

}